

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall
ncnn::Mat::create(Mat *this,int _w,size_t _elemsize,int _elempack,Allocator *_allocator)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  ulong uVar3;
  
  if ((((this->dims != 1) || (this->w != _w)) || (this->elemsize != _elemsize)) ||
     ((this->elempack != _elempack || (this->allocator != _allocator)))) {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = _elempack;
    this->allocator = _allocator;
    this->dims = 1;
    this->w = _w;
    this->h = 1;
    this->d = 1;
    this->c = 1;
    this->cstep = (long)_w;
    if (_w != 0) {
      uVar3 = (long)_w * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar2 = fastMalloc(uVar3 + 4);
      }
      else {
        iVar1 = (*_allocator->_vptr_Allocator[2])(_allocator);
        pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
      }
      this->data = pvVar2;
      this->refcount = (int *)((long)pvVar2 + uVar3);
      *(undefined4 *)((long)pvVar2 + uVar3) = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 1 && w == _w && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 1;
    w = _w;
    h = 1;
    d = 1;
    c = 1;

    cstep = w;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}